

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

void __thiscall
Fl_Text_Buffer::add_modify_callback
          (Fl_Text_Buffer *this,Fl_Text_Modify_Cb bufModifiedCB,void *cbArg)

{
  int iVar1;
  Fl_Text_Modify_Cb *pp_Var2;
  void **ppvVar3;
  Fl_Text_Modify_Cb *pp_Var4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  iVar1 = this->mNModifyProcs;
  lVar7 = (long)iVar1;
  uVar8 = 0xffffffffffffffff;
  if (-2 < lVar7) {
    uVar8 = lVar7 * 8 + 8;
  }
  pp_Var4 = (Fl_Text_Modify_Cb *)operator_new__(uVar8);
  ppvVar5 = (void **)operator_new__(uVar8);
  if (0 < lVar7) {
    pp_Var2 = this->mModifyProcs;
    ppvVar3 = this->mCbArgs;
    lVar6 = 0;
    do {
      pp_Var4[lVar6 + 1] = pp_Var2[lVar6];
      ppvVar5[lVar6 + 1] = ppvVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  if (iVar1 != 0) {
    if (this->mModifyProcs != (Fl_Text_Modify_Cb *)0x0) {
      operator_delete__(this->mModifyProcs);
    }
    if (this->mCbArgs != (void **)0x0) {
      operator_delete__(this->mCbArgs);
    }
  }
  *pp_Var4 = bufModifiedCB;
  *ppvVar5 = cbArg;
  this->mNModifyProcs = this->mNModifyProcs + 1;
  this->mModifyProcs = pp_Var4;
  this->mCbArgs = ppvVar5;
  return;
}

Assistant:

void Fl_Text_Buffer::add_modify_callback(Fl_Text_Modify_Cb bufModifiedCB,
					 void *cbArg)
{
  Fl_Text_Modify_Cb *newModifyProcs =
  new Fl_Text_Modify_Cb[mNModifyProcs + 1];
  void **newCBArgs = new void *[mNModifyProcs + 1];
  for (int i = 0; i < mNModifyProcs; i++) {
    newModifyProcs[i + 1] = mModifyProcs[i];
    newCBArgs[i + 1] = mCbArgs[i];
  }
  if (mNModifyProcs != 0) {
    delete[]mModifyProcs;
    delete[]mCbArgs;
  }
  newModifyProcs[0] = bufModifiedCB;
  newCBArgs[0] = cbArg;
  mNModifyProcs++;
  mModifyProcs = newModifyProcs;
  mCbArgs = newCBArgs;
}